

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH64_hash_t XXH64(void *input,size_t len,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  XXH_alignment align;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  
  if (len < 0x20) {
    align = 0x165667c5;
    lVar9 = seed + 0x27d4eb2f165667c5;
  }
  else {
    align = 0x85ebca87;
    plVar8 = (long *)((long)input + (len - 0x1f));
    lVar9 = seed + 0x60ea27eeadc0b5d6;
    uVar3 = seed + 0xc2b2ae3d27d4eb4f;
    uVar7 = seed + 0x61c8864e7a143579;
    do {
      uVar5 = *input * -0x3d4d51c2d82b14b1 + lVar9;
      uVar6 = uVar5 * 0x80000000 | uVar5 >> 0x21;
      lVar9 = uVar6 * -0x61c8864e7a143579;
      uVar3 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar3;
      uVar4 = uVar3 * 0x80000000 | uVar3 >> 0x21;
      uVar3 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + seed;
      uVar2 = uVar3 * 0x80000000 | uVar3 >> 0x21;
      uVar3 = uVar4 * -0x61c8864e7a143579;
      seed = uVar2 * -0x61c8864e7a143579;
      uVar7 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar7;
      uVar5 = uVar7 * 0x80000000 | uVar7 >> 0x21;
      uVar7 = uVar5 * -0x61c8864e7a143579;
      input = (void *)((long)input + 0x20);
    } while (input < plVar8);
    lVar9 = ((uVar5 * -0x784349ab80000000 | uVar5 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar2 * -0x784349ab80000000 | uVar2 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar4 * -0x784349ab80000000 | uVar4 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar6 * -0x784349ab80000000 | uVar6 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            (uVar5 * -0x1939e850d5e40000 | uVar7 >> 0x2e) +
            (uVar2 * 0x779b185ebca87000 | seed >> 0x34) +
            (uVar4 * 0x1bbcd8c2f5e54380 | uVar3 >> 0x39) +
            (uVar6 * 0x3c6ef3630bd7950e | (ulong)(lVar9 < 0))) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  xVar1 = XXH64_finalize(lVar9 + len,(xxh_u8 *)input,len,align);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64 (XXH_NOESCAPE const void* input, size_t len, XXH64_hash_t seed)
{
#if !defined(XXH_NO_STREAM) && XXH_SIZE_OPT >= 2
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_state_t state;
    XXH64_reset(&state, seed);
    XXH64_update(&state, (const xxh_u8*)input, len);
    return XXH64_digest(&state);
#else
    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 7)==0) {  /* Input is aligned, let's leverage the speed advantage */
            return XXH64_endian_align((const xxh_u8*)input, len, seed, XXH_aligned);
    }   }

    return XXH64_endian_align((const xxh_u8*)input, len, seed, XXH_unaligned);

#endif
}